

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t
psa_key_derivation_setup_kdf(psa_key_derivation_operation_t *operation,psa_algorithm_t kdf_alg)

{
  uint uVar1;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  size_t hash_size;
  psa_algorithm_t hash_alg;
  psa_algorithm_t kdf_alg_local;
  psa_key_derivation_operation_t *operation_local;
  
  memset(&operation->ctx,0,0x208);
  if ((((kdf_alg & 0xffffff00) == 0x20000100) || ((kdf_alg & 0xffffff00) == 0x20000200)) ||
     ((kdf_alg & 0xffffff00) == 0x20000300)) {
    uVar1 = kdf_alg & 0xff;
    if ((uVar1 | 0x1000000) == 0x1000001) {
      local_2c = 0x10;
    }
    else {
      if ((uVar1 | 0x1000000) == 0x1000002) {
        local_30 = 0x10;
      }
      else {
        if ((uVar1 | 0x1000000) == 0x1000003) {
          local_34 = 0x10;
        }
        else {
          if ((uVar1 | 0x1000000) == 0x1000004) {
            local_38 = 0x14;
          }
          else {
            if ((uVar1 | 0x1000000) == 0x1000005) {
              local_3c = 0x14;
            }
            else {
              if ((uVar1 | 0x1000000) == 0x1000008) {
                local_40 = 0x1c;
              }
              else {
                if ((uVar1 | 0x1000000) == 0x1000009) {
                  local_44 = 0x20;
                }
                else {
                  if ((uVar1 | 0x1000000) == 0x100000a) {
                    local_48 = 0x30;
                  }
                  else {
                    if ((uVar1 | 0x1000000) == 0x100000b) {
                      local_4c = 0x40;
                    }
                    else {
                      if ((uVar1 | 0x1000000) == 0x100000c) {
                        local_50 = 0x1c;
                      }
                      else {
                        if ((uVar1 | 0x1000000) == 0x100000d) {
                          local_54 = 0x20;
                        }
                        else {
                          if ((uVar1 | 0x1000000) == 0x1000010) {
                            local_58 = 0x1c;
                          }
                          else {
                            if ((uVar1 | 0x1000000) == 0x1000011) {
                              local_5c = 0x20;
                            }
                            else {
                              if ((uVar1 | 0x1000000) == 0x1000012) {
                                local_60 = 0x30;
                              }
                              else {
                                local_60 = 0;
                                if ((uVar1 | 0x1000000) == 0x1000013) {
                                  local_60 = 0x40;
                                }
                              }
                              local_5c = local_60;
                            }
                            local_58 = local_5c;
                          }
                          local_54 = local_58;
                        }
                        local_50 = local_54;
                      }
                      local_4c = local_50;
                    }
                    local_48 = local_4c;
                  }
                  local_44 = local_48;
                }
                local_40 = local_44;
              }
              local_3c = local_40;
            }
            local_38 = local_3c;
          }
          local_34 = local_38;
        }
        local_30 = local_34;
      }
      local_2c = local_30;
    }
    if ((long)local_2c == 0) {
      operation_local._4_4_ = -0x86;
    }
    else if ((((kdf_alg & 0xffffff00) == 0x20000200) || ((kdf_alg & 0xffffff00) == 0x20000300)) &&
            (((uVar1 | 0x1000000) != 0x1000009 && ((uVar1 | 0x1000000) != 0x100000a)))) {
      operation_local._4_4_ = -0x86;
    }
    else {
      operation->capacity = (long)local_2c * 0xff;
      operation_local._4_4_ = 0;
    }
  }
  else {
    operation_local._4_4_ = -0x86;
  }
  return operation_local._4_4_;
}

Assistant:

static psa_status_t psa_key_derivation_setup_kdf(
    psa_key_derivation_operation_t *operation,
    psa_algorithm_t kdf_alg )
{
    /* Make sure that operation->ctx is properly zero-initialised. (Macro
     * initialisers for this union leave some bytes unspecified.) */
    memset( &operation->ctx, 0, sizeof( operation->ctx ) );

    /* Make sure that kdf_alg is a supported key derivation algorithm. */
#if defined(MBEDTLS_MD_C)
    if( PSA_ALG_IS_HKDF( kdf_alg ) ||
        PSA_ALG_IS_TLS12_PRF( kdf_alg ) ||
        PSA_ALG_IS_TLS12_PSK_TO_MS( kdf_alg ) )
    {
        psa_algorithm_t hash_alg = PSA_ALG_HKDF_GET_HASH( kdf_alg );
        size_t hash_size = PSA_HASH_SIZE( hash_alg );
        if( hash_size == 0 )
            return( PSA_ERROR_NOT_SUPPORTED );
        if( ( PSA_ALG_IS_TLS12_PRF( kdf_alg ) ||
              PSA_ALG_IS_TLS12_PSK_TO_MS( kdf_alg ) ) &&
            ! ( hash_alg == PSA_ALG_SHA_256 || hash_alg == PSA_ALG_SHA_384 ) )
        {
            return( PSA_ERROR_NOT_SUPPORTED );
        }
        operation->capacity = 255 * hash_size;
        return( PSA_SUCCESS );
    }
#endif /* MBEDTLS_MD_C */
    else
        return( PSA_ERROR_NOT_SUPPORTED );
}